

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<AssertionTest_assertLtHandlerShouldBeCalled_Test>::CreateTest
          (TestFactoryImpl<AssertionTest_assertLtHandlerShouldBeCalled_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<AssertionTest_assertLtHandlerShouldBeCalled_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x38);
  AssertionTest_assertLtHandlerShouldBeCalled_Test::AssertionTest_assertLtHandlerShouldBeCalled_Test
            ((AssertionTest_assertLtHandlerShouldBeCalled_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }